

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_LRU.cc
# Opt level: O3

void __thiscall MyDB_LRU::adjust(MyDB_LRU *this,pair<std::shared_ptr<MyDB_Table>,_long> *curId)

{
  _Base_ptr p_Var1;
  long lVar2;
  _Base_ptr p_Var3;
  Node *pNVar4;
  iterator iVar5;
  
  iVar5 = std::
          _Rb_tree<std::pair<std::shared_ptr<MyDB_Table>,_long>,_std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>,_std::_Select1st<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>_>
          ::find(&(this->LRUmap)._M_t,curId);
  if ((_Rb_tree_header *)iVar5._M_node != &(this->LRUmap)._M_t._M_impl.super__Rb_tree_header) {
    p_Var1 = iVar5._M_node[1]._M_right;
    lVar2 = *(long *)p_Var1;
    p_Var3 = p_Var1->_M_parent;
    *(_Base_ptr *)(lVar2 + 8) = p_Var3;
    *(long *)p_Var3 = lVar2;
    pNVar4 = this->head;
    *(Node **)p_Var1 = pNVar4;
    p_Var3 = (_Base_ptr)pNVar4->next;
    p_Var1->_M_parent = p_Var3;
    *(_Base_ptr *)p_Var3 = p_Var1;
    pNVar4->next = (Node *)p_Var1;
  }
  return;
}

Assistant:

void MyDB_LRU:: adjust(pair<MyDB_TablePtr, long> curId) {
    map<pair<MyDB_TablePtr, long>, Node*>:: iterator it_LRUmap = LRUmap.find(curId);
    if (it_LRUmap != LRUmap.end()) {
        Node* node = it_LRUmap -> second;
        node -> pre -> next = node -> next;
        node -> next -> pre = node -> pre;
        node -> pre = this -> head;
        node -> next = this -> head -> next;
        this -> head -> next -> pre = node;
        this -> head -> next = node;
    }
}